

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O3

void CompiledMixedType<unsigned_int,long_long>(void)

{
  uint32_t a;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar1;
  uint32_t tmp;
  int64_t u1;
  uint32_t local_3c;
  int64_t local_38;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_2c;
  
  local_38 = 0;
  local_3c = 0;
  LargeIntRegMultiply<unsigned_int,long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (0,&local_38,&local_3c);
  local_38 = 0;
  local_3c = 0;
  LargeIntRegMultiply<unsigned_int,long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (0,&local_38,&local_3c);
  local_38 = 0;
  local_3c = 0;
  LargeIntRegMultiply<unsigned_int,long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (0,&local_38,&local_3c);
  a = local_3c;
  local_38 = 0;
  local_3c = 0;
  LargeIntRegMultiply<unsigned_int,long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (a,&local_38,&local_3c);
  local_2c.m_int = 1;
  local_38 = 1;
  local_3c = 0;
  DivisionHelper<unsigned_int,long_long,1>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_2c.m_int,&local_38,&local_3c);
  operator/(1,local_2c);
  local_38 = 1;
  DivisionHelper<unsigned_int,long_long,1>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_2c.m_int,&local_38,&local_2c.m_int);
  local_38 = 1;
  DivisionHelper<unsigned_int,long_long,1>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_2c.m_int,&local_38,&local_2c.m_int);
  if ((local_2c.m_int != 0xffffffff) &&
     (local_2c.m_int = local_2c.m_int + 1, local_2c.m_int != 0xffffffff)) {
    local_2c.m_int = 0;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator<<((SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2c,1);
    SVar1 = SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ::operator<<((SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                          *)&local_2c,
                         (SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          )0x1);
    operator<<(SVar1.m_int,
               (SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )0x1);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator<<=((SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_2c,1);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator<<=((SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_2c,
                (SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                 )0x1);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator>>((SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2c,1);
    SVar1 = SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ::operator>>((SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                          *)&local_2c,
                         (SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          )0x1);
    operator>>(SVar1.m_int,
               (SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )0x1);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator>>=((SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_2c,1);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator>>=((SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_2c,
                (SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                 )0x1);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}